

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdGetLastErrorCode(void *handle)

{
  CfdException *except;
  CfdException last_error;
  void *in_stack_00000140;
  CfdCapiManager *in_stack_00000148;
  CfdException *in_stack_ffffffffffffffb0;
  CfdException local_40;
  CfdError local_4;
  
  cfd::capi::CfdCapiManager::GetLastError(in_stack_00000148,in_stack_00000140);
  local_4 = cfd::core::CfdException::GetErrorCode(&local_40);
  cfd::core::CfdException::~CfdException(in_stack_ffffffffffffffb0);
  return local_4;
}

Assistant:

int CfdGetLastErrorCode(void* handle) {
  try {
    CfdException last_error = cfd::capi::capi_instance.GetLastError(handle);
    return last_error.GetErrorCode();
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}